

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_qcd(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,
                          opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  OPJ_BOOL OVar2;
  OPJ_BYTE *pOVar3;
  OPJ_SIZE_T OVar4;
  OPJ_BYTE *new_header_tile_data;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 l_remaining_size;
  OPJ_UINT32 l_qcd_size;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  _l_remaining_size = p_manager;
  p_manager_local = (opj_event_mgr_t *)p_stream;
  p_stream_local = (opj_stream_private_t *)p_j2k;
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xb9e,
                  "OPJ_BOOL opj_j2k_write_qcd(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    if (p_stream == (opj_stream_private_t *)0x0) {
      __assert_fail("p_stream != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0xba0,
                    "OPJ_BOOL opj_j2k_write_qcd(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    OVar1 = opj_j2k_get_SQcd_SQcc_size(p_j2k,p_j2k->m_current_tile_number,0);
    l_current_data._0_4_ = OVar1 + 4;
    l_current_data._4_4_ = (uint)l_current_data;
    if (*(uint *)&p_stream_local->m_opj_skip < (uint)l_current_data) {
      pOVar3 = (OPJ_BYTE *)opj_realloc(p_stream_local->m_current_data,(ulong)(uint)l_current_data);
      if (pOVar3 == (OPJ_BYTE *)0x0) {
        opj_free(p_stream_local->m_current_data);
        p_stream_local->m_current_data = (OPJ_BYTE *)0x0;
        *(undefined4 *)&p_stream_local->m_opj_skip = 0;
        opj_event_msg(_l_remaining_size,1,"Not enough memory to write QCD marker\n");
        return 0;
      }
      p_stream_local->m_current_data = pOVar3;
      *(uint *)&p_stream_local->m_opj_skip = l_current_data._4_4_;
    }
    pOVar3 = p_stream_local->m_current_data;
    opj_write_bytes_LE(pOVar3,0xff5c,2);
    opj_write_bytes_LE(pOVar3 + 2,l_current_data._4_4_ - 2,2);
    l_current_data._0_4_ = (uint)l_current_data - 4;
    OVar2 = opj_j2k_write_SQcd_SQcc
                      ((opj_j2k_t *)p_stream_local,*(OPJ_UINT32 *)&p_stream_local[2].m_seek_fn,0,
                       pOVar3 + 4,(OPJ_UINT32 *)&l_current_data,_l_remaining_size);
    if (OVar2 == 0) {
      opj_event_msg(_l_remaining_size,1,"Error writing QCD marker\n");
      p_j2k_local._4_4_ = 0;
    }
    else if ((uint)l_current_data == 0) {
      OVar4 = opj_stream_write_data
                        ((opj_stream_private_t *)p_manager_local,p_stream_local->m_current_data,
                         (ulong)l_current_data._4_4_,_l_remaining_size);
      if (OVar4 == l_current_data._4_4_) {
        p_j2k_local._4_4_ = 1;
      }
      else {
        p_j2k_local._4_4_ = 0;
      }
    }
    else {
      opj_event_msg(_l_remaining_size,1,"Error writing QCD marker\n");
      p_j2k_local._4_4_ = 0;
    }
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0xb9f,
                "OPJ_BOOL opj_j2k_write_qcd(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_qcd(opj_j2k_t *p_j2k,
                                  opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_UINT32 l_qcd_size, l_remaining_size;
    OPJ_BYTE * l_current_data = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    l_qcd_size = 4 + opj_j2k_get_SQcd_SQcc_size(p_j2k, p_j2k->m_current_tile_number,
                 0);
    l_remaining_size = l_qcd_size;

    if (l_qcd_size > p_j2k->m_specific_param.m_encoder.m_header_tile_data_size) {
        OPJ_BYTE *new_header_tile_data = (OPJ_BYTE *) opj_realloc(
                                             p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_qcd_size);
        if (! new_header_tile_data) {
            opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
            p_j2k->m_specific_param.m_encoder.m_header_tile_data = NULL;
            p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to write QCD marker\n");
            return OPJ_FALSE;
        }
        p_j2k->m_specific_param.m_encoder.m_header_tile_data = new_header_tile_data;
        p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = l_qcd_size;
    }

    l_current_data = p_j2k->m_specific_param.m_encoder.m_header_tile_data;

    opj_write_bytes(l_current_data, J2K_MS_QCD, 2);         /* QCD */
    l_current_data += 2;

    opj_write_bytes(l_current_data, l_qcd_size - 2, 2);     /* L_QCD */
    l_current_data += 2;

    l_remaining_size -= 4;

    if (! opj_j2k_write_SQcd_SQcc(p_j2k, p_j2k->m_current_tile_number, 0,
                                  l_current_data, &l_remaining_size, p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR, "Error writing QCD marker\n");
        return OPJ_FALSE;
    }

    if (l_remaining_size != 0) {
        opj_event_msg(p_manager, EVT_ERROR, "Error writing QCD marker\n");
        return OPJ_FALSE;
    }

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_qcd_size,
                              p_manager) != l_qcd_size) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}